

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

XMLNode * XMLNode_get_child(XMLNode *node,int i_child)

{
  int local_20;
  int local_1c;
  int i;
  int i_child_local;
  XMLNode *node_local;
  
  if ((((node != (XMLNode *)0x0) && (node->init_value == 0x19770522)) && (-1 < i_child)) &&
     (i_child < node->n_children)) {
    local_1c = i_child;
    for (local_20 = 0; local_20 < node->n_children; local_20 = local_20 + 1) {
      if (node->children[local_20]->active == 0) {
        local_1c = local_1c + 1;
      }
      else if (local_20 == local_1c) {
        return node->children[local_20];
      }
    }
  }
  return (XMLNode *)0x0;
}

Assistant:

XMLNode* XMLNode_get_child(const XMLNode* node, int i_child)
{
	int i;
	
	if (node == NULL || node->init_value != XML_INIT_DONE || i_child < 0 || i_child >= node->n_children)
		return NULL;
	
	for (i = 0; i < node->n_children; i++) {
		if (!node->children[i]->active)
			i_child++;
		else if (i == i_child)
			return node->children[i];
	}
	
	return NULL;
}